

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

ArgEscapeData * findArgEscapes(ArgEscapeData *__return_storage_ptr__,QStringView s)

{
  storage_type_conflict *psVar1;
  storage_type_conflict sVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  storage_type_conflict *psVar6;
  storage_type_conflict *psVar7;
  storage_type_conflict *psVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  storage_type_conflict *psVar12;
  int iVar13;
  storage_type_conflict sVar14;
  
  psVar1 = s.m_data + s.m_size;
  *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->occurrences = 0;
  __return_storage_ptr__->locale_occurrences = 0;
  __return_storage_ptr__->escape_len = 0;
  iVar9 = 0x7fffffff;
  lVar4 = 0;
  lVar10 = 0;
  lVar11 = 0;
  psVar8 = s.m_data;
  while (psVar8 != psVar1) {
    psVar12 = psVar8 + -1;
    do {
      psVar6 = psVar8;
      if (psVar6 == psVar1) goto LAB_0014eca1;
      psVar7 = psVar6 + 1;
      psVar12 = psVar12 + 1;
      psVar8 = psVar7;
    } while (*psVar6 != L'%');
    if (psVar7 == psVar1) break;
    sVar2 = *psVar7;
    sVar14 = sVar2;
    if (sVar2 == L'L') {
      psVar7 = psVar6 + 2;
      if (psVar7 == psVar1) break;
      sVar14 = psVar6[2];
    }
    iVar5 = (ushort)sVar14 - 0x30;
    psVar8 = psVar7;
    if (iVar5 != -1 && 0xfff5 < (ushort)(sVar14 + L'ￆ')) {
      psVar8 = psVar1;
      iVar13 = iVar5;
      if (psVar7 + 1 != psVar1) {
        iVar3 = (ushort)psVar7[1] - 0x30;
        if (9 < (ushort)((ushort)psVar7[1] - 0x30)) {
          iVar3 = -1;
        }
        iVar13 = iVar5 * 10 + iVar3;
        psVar8 = psVar7 + 2;
        if (iVar3 == -1) {
          psVar8 = psVar7 + 1;
          iVar13 = iVar5;
        }
      }
      if (iVar13 <= iVar9) {
        if (iVar13 < iVar9) {
          lVar4 = 0;
          lVar10 = 0;
          lVar11 = 0;
          iVar9 = iVar13;
        }
        lVar11 = lVar11 + 1;
        lVar4 = lVar4 + (ulong)(sVar2 == L'L');
        lVar10 = lVar10 + ((long)psVar8 - (long)psVar12 >> 1);
      }
    }
  }
LAB_0014eca1:
  __return_storage_ptr__->min_escape = iVar9;
  __return_storage_ptr__->occurrences = lVar11;
  __return_storage_ptr__->escape_len = lVar10;
  __return_storage_ptr__->locale_occurrences = lVar4;
  return __return_storage_ptr__;
}

Assistant:

static ArgEscapeData findArgEscapes(QStringView s)
{
    const QChar *uc_begin = s.begin();
    const QChar *uc_end = s.end();

    ArgEscapeData d;

    d.min_escape = INT_MAX;
    d.occurrences = 0;
    d.escape_len = 0;
    d.locale_occurrences = 0;

    const QChar *c = uc_begin;
    while (c != uc_end) {
        while (c != uc_end && c->unicode() != '%')
            ++c;

        if (c == uc_end)
            break;
        const QChar *escape_start = c;
        if (++c == uc_end)
            break;

        bool locale_arg = false;
        if (c->unicode() == 'L') {
            locale_arg = true;
            if (++c == uc_end)
                break;
        }

        int escape = qArgDigitValue(*c);
        if (escape == -1)
            continue;

        // ### Qt 7: do not allow anything but ASCII digits
        // in arg()'s replacements.
#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
        const QChar *escapeBegin = c;
        const QChar *escapeEnd = escapeBegin + 1;
#endif

        ++c;

        if (c != uc_end) {
            const int next_escape = qArgDigitValue(*c);
            if (next_escape != -1) {
                escape = (10 * escape) + next_escape;
                ++c;
#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
                ++escapeEnd;
#endif
            }
        }

#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
        checkArgEscape(QStringView(escapeBegin, escapeEnd));
#endif

        if (escape > d.min_escape)
            continue;

        if (escape < d.min_escape) {
            d.min_escape = escape;
            d.occurrences = 0;
            d.escape_len = 0;
            d.locale_occurrences = 0;
        }

        ++d.occurrences;
        if (locale_arg)
            ++d.locale_occurrences;
        d.escape_len += c - escape_start;
    }
    return d;
}